

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O1

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::ByteBufferGetter
          (string *__return_storage_ptr__,KotlinGenerator *this,Type *type,string *bb_var_name)

{
  ulong uVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  size_type *psVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  char *pcVar8;
  ulong uVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_6;
  allocator<char> local_c9;
  _Alloc_hider local_c8;
  undefined4 local_c0;
  undefined4 uStack_bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_b8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  switch(type->base_type) {
  case BASE_TYPE_NONE:
  case BASE_TYPE_UTYPE:
  case BASE_TYPE_CHAR:
  case BASE_TYPE_UCHAR:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (bb_var_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + bb_var_name->_M_string_length);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case BASE_TYPE_BOOL:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,
                   "0.toByte() != ",bb_var_name);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar3 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p == &aStack_b8) {
      return __return_storage_ptr__;
    }
    goto LAB_001e43b0;
  case BASE_TYPE_SHORT:
  case BASE_TYPE_USHORT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (bb_var_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + bb_var_name->_M_string_length);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case BASE_TYPE_INT:
  case BASE_TYPE_UINT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (bb_var_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + bb_var_name->_M_string_length);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case BASE_TYPE_LONG:
  case BASE_TYPE_ULONG:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (bb_var_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + bb_var_name->_M_string_length);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case BASE_TYPE_FLOAT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (bb_var_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + bb_var_name->_M_string_length);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case BASE_TYPE_DOUBLE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (bb_var_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + bb_var_name->_M_string_length);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case BASE_TYPE_STRING:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "__string";
    pcVar7 = "";
    goto LAB_001e41e8;
  case BASE_TYPE_VECTOR:
    local_c0 = *(undefined4 *)&type->struct_def;
    uStack_bc = *(undefined4 *)((long)&type->struct_def + 4);
    aStack_b8._M_allocated_capacity._0_4_ = *(undefined4 *)&type->enum_def;
    aStack_b8._M_allocated_capacity._4_4_ = *(undefined4 *)((long)&type->enum_def + 4);
    aStack_b8._8_2_ = type->fixed_length;
    local_c8._M_p._4_4_ = 0;
    local_c8._M_p._0_4_ = type->element;
    pcVar2 = (bb_var_name->_M_dataplus)._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + bb_var_name->_M_string_length);
    ByteBufferGetter(__return_storage_ptr__,this,(Type *)&local_c8,&local_48);
    _Var11._M_p = local_48._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_001e43b5;
  case BASE_TYPE_STRUCT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "__struct";
    pcVar7 = "";
    goto LAB_001e41e8;
  case BASE_TYPE_UNION:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "__union";
    pcVar7 = "";
LAB_001e41e8:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar8,pcVar7);
    break;
  default:
    pcVar2 = (bb_var_name->_M_dataplus)._M_p;
    local_c8._M_p = (pointer)&aStack_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar2,pcVar2 + bb_var_name->_M_string_length);
    std::__cxx11::string::append((char *)&local_c8);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"get","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,
               *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::BaseType_const&)::kotlin_typename +
                         (ulong)type->base_type * 8),&local_c9);
    Namer::Method(&local_a8,&(this->namer_).super_Namer,&local_88,&local_68);
    uVar1 = local_a8._M_string_length + CONCAT44(uStack_bc,local_c0);
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != &aStack_b8) {
      uVar9 = CONCAT44(aStack_b8._M_allocated_capacity._4_4_,aStack_b8._M_allocated_capacity._0_4_);
    }
    if (uVar9 < uVar1) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        uVar10 = local_a8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < uVar1) goto LAB_001e42bf;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_c8._M_p);
    }
    else {
LAB_001e42bf:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_a8._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = puVar5 + 2;
    if ((size_type *)*puVar5 == psVar6) {
      uVar10 = puVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar10;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = puVar5[1];
    *puVar5 = psVar6;
    puVar5[1] = 0;
    *(undefined1 *)psVar6 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p == &aStack_b8) {
      return __return_storage_ptr__;
    }
LAB_001e43b0:
    local_48.field_2._M_allocated_capacity =
         CONCAT44(aStack_b8._M_allocated_capacity._4_4_,aStack_b8._M_allocated_capacity._0_4_);
    _Var11._M_p = local_c8._M_p;
LAB_001e43b5:
    operator_delete(_Var11._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ByteBufferGetter(const Type &type,
                               std::string bb_var_name) const {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "__string";
      case BASE_TYPE_STRUCT: return "__struct";
      case BASE_TYPE_UNION: return "__union";
      case BASE_TYPE_VECTOR:
        return ByteBufferGetter(type.VectorType(), bb_var_name);
      case BASE_TYPE_INT:
      case BASE_TYPE_UINT: return bb_var_name + ".getInt";
      case BASE_TYPE_SHORT:
      case BASE_TYPE_USHORT: return bb_var_name + ".getShort";
      case BASE_TYPE_ULONG:
      case BASE_TYPE_LONG: return bb_var_name + ".getLong";
      case BASE_TYPE_FLOAT: return bb_var_name + ".getFloat";
      case BASE_TYPE_DOUBLE: return bb_var_name + ".getDouble";
      case BASE_TYPE_CHAR:
      case BASE_TYPE_UCHAR:
      case BASE_TYPE_NONE:
      case BASE_TYPE_UTYPE: return bb_var_name + ".get";
      case BASE_TYPE_BOOL: return "0.toByte() != " + bb_var_name + ".get";
      default:
        return bb_var_name + "." +
               namer_.Method("get", GenTypeBasic(type.base_type));
    }
  }